

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMConnection INT_CMinitiate_conn(CManager_conflict cm,attr_list attrs)

{
  int iVar1;
  CMConnection conn_00;
  FILE *in_RSI;
  long in_RDI;
  CMConnection conn;
  CMTraceType in_stack_0000002c;
  CManager in_stack_00000030;
  attr_list in_stack_00000090;
  CManager_conflict in_stack_00000098;
  
  if (*(int *)(in_RDI + 8) == 0) {
    CMinitialize((CManager_conflict)conn);
  }
  iVar1 = CMtrace_val[2];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_00000030,in_stack_0000002c);
  }
  if (iVar1 != 0) {
    fprintf(*(FILE **)(in_RDI + 0x120),"Doing CMinitiate_conn\n");
  }
  conn_00 = CMinternal_initiate_conn(in_stack_00000098,in_stack_00000090);
  iVar1 = CMtrace_val[2];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_00000030,in_stack_0000002c);
  }
  if (iVar1 != 0) {
    if (conn_00 == (CMConnection)0x0) {
      fprintf(*(FILE **)(in_RDI + 0x120),"NULL\n");
    }
    else {
      fdump_CMConnection(in_RSI,conn_00);
    }
  }
  return conn_00;
}

Assistant:

CMConnection
 INT_CMinitiate_conn(CManager cm, attr_list attrs)
 {
     CMConnection conn;
     if (!cm->initialized) CMinitialize(cm);
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 fprintf(cm->CMTrace_file,"Doing CMinitiate_conn\n");
     }
     conn = CMinternal_initiate_conn(cm, attrs);
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 if (conn != NULL) {
	     fdump_CMConnection(cm->CMTrace_file, conn);
	 } else {
	     fprintf(cm->CMTrace_file, "NULL\n");
	 }
     }
     return conn;
 }